

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2646:23)>
::getImpl(SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:2646:23)>
          *this,ExceptionOrValue *output)

{
  Exception *exception;
  ExceptionOr<kj::Maybe<kj::OwnFd>_> *pEVar1;
  ReadResult *in;
  Maybe<kj::OwnFd> local_550;
  ExceptionOr<kj::Maybe<kj::OwnFd>_> local_548;
  ReadResult *local_3a0;
  ReadResult *depValue;
  ReadResult *_depValue779;
  Exception *local_1e8;
  Exception *depException;
  Exception *_depException777;
  undefined1 local_1c8 [8];
  ExceptionOr<kj::AsyncCapabilityStream::ReadResult> depResult;
  ExceptionOrValue *output_local;
  SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:2646:23)>
  *this_local;
  
  depResult.value.ptr.field_1.value.capCount = (size_t)output;
  ExceptionOr<kj::AsyncCapabilityStream::ReadResult>::ExceptionOr
            ((ExceptionOr<kj::AsyncCapabilityStream::ReadResult> *)local_1c8);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_1c8);
  depException = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1c8);
  if (depException == (Exception *)0x0) {
    depValue = readMaybe<kj::AsyncCapabilityStream::ReadResult>
                         ((Maybe<kj::AsyncCapabilityStream::ReadResult> *)
                          ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1.value.
                                  details.builder + 0x18));
    if (depValue != (ReadResult *)0x0) {
      local_3a0 = depValue;
      in = mv<kj::AsyncCapabilityStream::ReadResult>(depValue);
      MaybeVoidCaller<kj::AsyncCapabilityStream::ReadResult,kj::Maybe<kj::OwnFd>>::
      apply<kj::AsyncCapabilityStream::tryReceiveFd()::__0>
                ((MaybeVoidCaller<kj::AsyncCapabilityStream::ReadResult,kj::Maybe<kj::OwnFd>> *)
                 &local_550,&this->func,in);
      TransformPromiseNodeBase::handle<kj::Maybe<kj::OwnFd>>
                (&local_548,&this->super_TransformPromiseNodeBase,&local_550);
      pEVar1 = ExceptionOrValue::as<kj::Maybe<kj::OwnFd>>
                         ((ExceptionOrValue *)depResult.value.ptr.field_1.value.capCount);
      ExceptionOr<kj::Maybe<kj::OwnFd>_>::operator=(pEVar1,&local_548);
      ExceptionOr<kj::Maybe<kj::OwnFd>_>::~ExceptionOr(&local_548);
      Maybe<kj::OwnFd>::~Maybe(&local_550);
    }
  }
  else {
    local_1e8 = depException;
    exception = mv<kj::Exception>(depException);
    ExceptionOr<kj::Maybe<kj::OwnFd>_>::ExceptionOr
              ((ExceptionOr<kj::Maybe<kj::OwnFd>_> *)&_depValue779,false,exception);
    pEVar1 = ExceptionOrValue::as<kj::Maybe<kj::OwnFd>>
                       ((ExceptionOrValue *)depResult.value.ptr.field_1.value.capCount);
    ExceptionOr<kj::Maybe<kj::OwnFd>_>::operator=
              (pEVar1,(ExceptionOr<kj::Maybe<kj::OwnFd>_> *)&_depValue779);
    ExceptionOr<kj::Maybe<kj::OwnFd>_>::~ExceptionOr
              ((ExceptionOr<kj::Maybe<kj::OwnFd>_> *)&_depValue779);
  }
  ExceptionOr<kj::AsyncCapabilityStream::ReadResult>::~ExceptionOr
            ((ExceptionOr<kj::AsyncCapabilityStream::ReadResult> *)local_1c8);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }